

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_function_helpers(t_dart_generator *this,t_function *tfunction)

{
  t_program *program;
  bool bVar1;
  uint uVar2;
  string *psVar3;
  t_type *ptVar4;
  t_struct *this_00;
  reference pptVar5;
  allocator local_251;
  string local_250;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_230
  ;
  t_field **local_228;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_220
  ;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *xs;
  string local_200;
  undefined1 local_1e0 [8];
  t_field success;
  string local_120;
  string local_100;
  undefined1 local_e0 [8];
  t_struct result;
  t_function *tfunction_local;
  t_dart_generator *this_local;
  
  result._192_8_ = tfunction;
  bVar1 = t_function::is_oneway(tfunction);
  if (!bVar1) {
    program = (this->super_t_oop_generator).super_t_generator.program_;
    psVar3 = t_function::get_name_abi_cxx11_((t_function *)result._192_8_);
    std::__cxx11::string::string((string *)&local_120,(string *)psVar3);
    get_result_class_name(&local_100,this,&local_120);
    t_struct::t_struct((t_struct *)local_e0,program,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    ptVar4 = t_function::get_returntype((t_function *)result._192_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,"success",(allocator *)((long)&xs + 7));
    t_field::t_field((t_field *)local_1e0,ptVar4,&local_200,0);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)((long)&xs + 7));
    ptVar4 = t_function::get_returntype((t_function *)result._192_8_);
    uVar2 = (*(ptVar4->super_t_doc)._vptr_t_doc[4])();
    if ((uVar2 & 1) == 0) {
      t_struct::append((t_struct *)local_e0,(t_field *)local_1e0);
    }
    this_00 = t_function::get_xceptions((t_function *)result._192_8_);
    f_iter._M_current = (t_field **)t_struct::get_members(this_00);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_220);
    local_228 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_220._M_current = local_228;
    while( true ) {
      local_230._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_220,&local_230);
      if (!bVar1) break;
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_220);
      t_struct::append((t_struct *)local_e0,*pptVar5);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_220);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_250,"",&local_251);
    generate_dart_struct_definition
              (this,(ostream *)&this->f_service_,(t_struct *)local_e0,false,true,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    t_field::~t_field((t_field *)local_1e0);
    t_struct::~t_struct((t_struct *)local_e0);
  }
  return;
}

Assistant:

void t_dart_generator::generate_function_helpers(t_function* tfunction) {
  if (tfunction->is_oneway()) {
    return;
  }

  t_struct result(program_, get_result_class_name(tfunction->get_name()));
  t_field success(tfunction->get_returntype(), "success", 0);
  if (!tfunction->get_returntype()->is_void()) {
    result.append(&success);
  }

  t_struct* xs = tfunction->get_xceptions();
  const vector<t_field*>& fields = xs->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    result.append(*f_iter);
  }

  generate_dart_struct_definition(f_service_, &result, false, true);
}